

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlIsNameChar(xmlParserCtxtPtr ctxt,int c)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  if (((uint)ctxt >> 0x11 & 1) == 0) {
    if ((0x3e < (uint)c) || ((0x4000800100000000U >> ((ulong)(uint)c & 0x3f) & 1) == 0)) {
      if (c - 0x30U < 0xb) {
        return 1;
      }
      if ((c & 0xffffffdfU) - 0x41 < 0x1a) {
        return 1;
      }
      if ((c - 0x2dU < 0x33) && ((0x4000000000003U >> ((ulong)(c - 0x2dU) & 0x3f) & 1) != 0)) {
        return 1;
      }
      if (c == 0xb7) {
        return 1;
      }
      auVar3._0_4_ = -(uint)(-0x7fffffff < (int)(c - 0x203fU ^ 0x80000000));
      auVar3._4_4_ = -(uint)(-0x7ffffee1 < (int)(c - 0x2070U ^ 0x80000000));
      auVar3._8_4_ = -(uint)(-0x7ffffc11 < (int)(c - 0x2c00U ^ 0x80000000));
      auVar3._12_4_ = -(uint)(-0x7fff5802 < (int)(c - 0x3001U ^ 0x80000000));
      auVar2._0_4_ = -(uint)(-0x7fffffea < (int)(c - 0xc0U ^ 0x80000000));
      auVar2._4_4_ = -(uint)(-0x7fffffe2 < (int)(c - 0xd8U ^ 0x80000000));
      auVar2._8_4_ = -(uint)(-0x7ffffd7b < (int)(c - 0xf8U ^ 0x80000000));
      auVar2._12_4_ = -(uint)(-0x7fffe380 < (int)(c - 0x37fU ^ 0x80000000));
      auVar2 = packssdw(auVar2,auVar3);
      auVar2 = packsswb(auVar2,auVar2);
      if ((((c - 0x10000U < 0xe0000 || c - 0xfdf0U < 0x20e) || c - 0xf900U < 0x4d0) ||
          (c & 0xfffffffeU) == 0x200c) ||
          (byte)(SUB161(auVar2 >> 7,0) & 1 | (SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar2 >> 0x17,0) & 1) << 2 | (SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar2 >> 0x27,0) & 1) << 4 | (SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar2 >> 0x37,0) & 1) << 6 | SUB161(auVar2 >> 0x3f,0) << 7) != 0xff) {
        return 1;
      }
    }
  }
  else {
    if (c < 0x100) {
      if (c - 0xc0U < 0x17) {
        return 1;
      }
      if ((c & 0xffffffdfU) - 0x41 < 0x1a) {
        return 1;
      }
      if (c - 0x30U < 10) {
        return 1;
      }
      if (0xf7 < c) {
        return 1;
      }
      if (c - 0xd8U < 0x1f) {
        return 1;
      }
    }
    else {
      iVar1 = xmlCharInRange(c,&xmlIsBaseCharGroup);
      if (iVar1 != 0) {
        return 1;
      }
      if ((c - 0x3021U < 9 || c - 0x4e00U < 0x51a6) || c == 0x3007) {
        return 1;
      }
      iVar1 = xmlCharInRange(c,&xmlIsDigitGroup);
      if (iVar1 != 0) {
        return 1;
      }
    }
    if ((c - 0x2dU < 0x33) && ((0x4000000002003U >> ((ulong)(c - 0x2dU) & 0x3f) & 1) != 0)) {
      return 1;
    }
    if (c < 0x100) {
      if (c == 0xb7) {
        return 1;
      }
    }
    else {
      iVar1 = xmlCharInRange(c,&xmlIsCombiningGroup);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = xmlCharInRange(c,&xmlIsExtenderGroup);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int
xmlIsNameChar(xmlParserCtxtPtr ctxt, int c) {
    if ((ctxt->options & XML_PARSE_OLD10) == 0) {
        /*
	 * Use the new checks of production [4] [4a] amd [5] of the
	 * Update 5 of XML-1.0
	 */
	if ((c != ' ') && (c != '>') && (c != '/') && /* accelerators */
	    (((c >= 'a') && (c <= 'z')) ||
	     ((c >= 'A') && (c <= 'Z')) ||
	     ((c >= '0') && (c <= '9')) || /* !start */
	     (c == '_') || (c == ':') ||
	     (c == '-') || (c == '.') || (c == 0xB7) || /* !start */
	     ((c >= 0xC0) && (c <= 0xD6)) ||
	     ((c >= 0xD8) && (c <= 0xF6)) ||
	     ((c >= 0xF8) && (c <= 0x2FF)) ||
	     ((c >= 0x300) && (c <= 0x36F)) || /* !start */
	     ((c >= 0x370) && (c <= 0x37D)) ||
	     ((c >= 0x37F) && (c <= 0x1FFF)) ||
	     ((c >= 0x200C) && (c <= 0x200D)) ||
	     ((c >= 0x203F) && (c <= 0x2040)) || /* !start */
	     ((c >= 0x2070) && (c <= 0x218F)) ||
	     ((c >= 0x2C00) && (c <= 0x2FEF)) ||
	     ((c >= 0x3001) && (c <= 0xD7FF)) ||
	     ((c >= 0xF900) && (c <= 0xFDCF)) ||
	     ((c >= 0xFDF0) && (c <= 0xFFFD)) ||
	     ((c >= 0x10000) && (c <= 0xEFFFF))))
	     return(1);
    } else {
        if ((IS_LETTER(c)) || (IS_DIGIT(c)) ||
            (c == '.') || (c == '-') ||
	    (c == '_') || (c == ':') ||
	    (IS_COMBINING(c)) ||
	    (IS_EXTENDER(c)))
	    return(1);
    }
    return(0);
}